

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Ps(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  Gia_Man_t *p;
  uint uVar5;
  char *pcVar6;
  uint local_84;
  uint local_80;
  uint local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  char *local_60;
  Gps_Par_t Pars;
  
  uVar5 = 0;
  Extra_UtilGetoptReset();
  local_84 = 0;
  local_80 = 0;
  local_7c = 0;
  local_78 = 0;
  local_74 = 0;
  local_70 = 0;
  local_60 = (char *)0x0;
  uVar4 = 0;
  bVar1 = false;
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Dtpcnlmasbh");
    switch(iVar2) {
    case 0x61:
      local_74 = local_74 ^ 1;
      break;
    case 0x62:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 99:
      local_84 = local_84 ^ 1;
      break;
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_00213043_caseD_64:
      iVar2 = -2;
      Abc_Print(-2,"usage: &ps [-tpcnlmasbh] [-D file]\n");
      Abc_Print(-2,"\t          prints stats of the current AIG\n");
      pcVar6 = "yes";
      pcVar3 = "yes";
      if (uVar4 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-t      : toggle printing BMC tents [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (uVar5 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p      : toggle printing switching activity [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_84 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle printing the size of frontier cut [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_80 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle printing NPN classes of functions [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_7c == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-l      : toggle printing LUT size profile [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_78 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_74 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle printing miter statistics [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_70 == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s      : skip mapping statistics even if mapped [default = %s]\n",pcVar3);
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-b      : toggle printing saved AIG statistics [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-D file : file name to dump statistics [default = none]\n");
      pcVar3 = "\t-h      : print the command usage\n";
LAB_0021325d:
      Abc_Print(iVar2,pcVar3);
      return 1;
    case 0x6c:
      local_7c = local_7c ^ 1;
      break;
    case 0x6d:
      local_78 = local_78 ^ 1;
      break;
    case 0x6e:
      local_80 = local_80 ^ 1;
      break;
    case 0x70:
      uVar5 = uVar5 ^ 1;
      break;
    case 0x73:
      local_70 = local_70 ^ 1;
      break;
    case 0x74:
      uVar4 = uVar4 ^ 1;
      break;
    default:
      if (iVar2 != 0x44) {
        if (iVar2 == -1) {
          Pars.pDumpFile = local_60;
          Pars.fSkipMap = local_70;
          Pars.fMiter = local_74;
          Pars.fMuxXor = local_78;
          Pars.fLutProf = local_7c;
          Pars.fNpn = local_80;
          Pars.fCut = local_84;
          if (bVar1) {
            p = pAbc->pGiaBest;
          }
          else {
            p = pAbc->pGia;
          }
          Pars.fTents = uVar4;
          Pars.fSwitch = uVar5;
          if (p != (Gia_Man_t *)0x0) {
            Gia_ManPrintStats(p,&Pars);
            return 0;
          }
          pcVar3 = "Abc_CommandAbc9Ps(): There is no AIG.\n";
          iVar2 = -1;
          goto LAB_0021325d;
        }
        goto switchD_00213043_caseD_64;
      }
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a file name.\n");
        goto switchD_00213043_caseD_64;
      }
      local_60 = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Ps( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gps_Par_t Pars, * pPars = &Pars;
    int c, fBest = 0;
    memset( pPars, 0, sizeof(Gps_Par_t) );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dtpcnlmasbh" ) ) != EOF )
    {
        switch ( c )
        {
        case 't':
            pPars->fTents ^= 1;
            break;
        case 'p':
            pPars->fSwitch ^= 1;
            break;
        case 'c':
            pPars->fCut ^= 1;
            break;
        case 'n':
            pPars->fNpn ^= 1;
            break;
        case 'l':
            pPars->fLutProf ^= 1;
            break;
        case 'm':
            pPars->fMuxXor ^= 1;
            break;
        case 'a':
            pPars->fMiter ^= 1;
            break;
        case 's':
            pPars->fSkipMap ^= 1;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pDumpFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'b':
            fBest ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fBest )
    {
        if ( pAbc->pGiaBest == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGiaBest, pPars );
    }
    else
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGia, pPars );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &ps [-tpcnlmasbh] [-D file]\n" );
    Abc_Print( -2, "\t          prints stats of the current AIG\n" );
    Abc_Print( -2, "\t-t      : toggle printing BMC tents [default = %s]\n",                pPars->fTents? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle printing switching activity [default = %s]\n",       pPars->fSwitch? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle printing the size of frontier cut [default = %s]\n", pPars->fCut? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle printing NPN classes of functions [default = %s]\n", pPars->fNpn? "yes": "no" );
    Abc_Print( -2, "\t-l      : toggle printing LUT size profile [default = %s]\n",         pPars->fLutProf? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",       pPars->fMuxXor? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle printing miter statistics [default = %s]\n",         pPars->fMiter? "yes": "no" );
    Abc_Print( -2, "\t-s      : skip mapping statistics even if mapped [default = %s]\n",   pPars->fSkipMap? "yes": "no" );
    Abc_Print( -2, "\t-b      : toggle printing saved AIG statistics [default = %s]\n",     fBest? "yes": "no" );
    Abc_Print( -2, "\t-D file : file name to dump statistics [default = none]\n" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}